

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvtable.cc
# Opt level: O0

vector<board::Move,_std::allocator<board::Move>_> * __thiscall
search::PVTable::getPV
          (vector<board::Move,_std::allocator<board::Move>_> *__return_storage_ptr__,PVTable *this,
          Board *pos)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Move local_34;
  Move move;
  int i;
  int originalPly;
  Board *pos_local;
  PVTable *this_local;
  vector<board::Move,_std::allocator<board::Move>_> *pv;
  
  iVar2 = board::Board::getPly(pos);
  move.score._3_1_ = 0;
  std::vector<board::Move,_std::allocator<board::Move>_>::vector(__return_storage_ptr__);
  for (move.value = 0; move.value < 0x40; move.value = move.value + 1) {
    local_34 = getMove(this,pos);
    iVar3 = board::Move::getValue(&local_34);
    if ((iVar3 == 0) || (bVar1 = board::makemove::move(&local_34,pos), !bVar1)) break;
    std::vector<board::Move,_std::allocator<board::Move>_>::push_back
              (__return_storage_ptr__,&local_34);
  }
  while (iVar3 = board::Board::getPly(pos), iVar2 < iVar3) {
    board::makemove::undo(pos);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<board::Move> search::PVTable::getPV(board::Board& pos)
{
    int originalPly = pos.getPly();
    std::vector<board::Move> pv;
    for (int i = 0; i < 64; i++) {
        board::Move move = getMove(pos);
        if (move.getValue() != 0 && board::makemove::move(move, pos)) {
            pv.push_back(move);
        }
        else {
            break;
        }
    }
    while (pos.getPly() > originalPly) {
        board::makemove::undo(pos);
    }
    return pv;
}